

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall
kj::Exception::setDetail(Exception *this,DetailTypeId typeId,Array<unsigned_char> *value)

{
  Detail *pDVar1;
  Detail local_30;
  
  pDVar1 = (this->details).builder.ptr;
  while( true ) {
    if (pDVar1 == (this->details).builder.pos) {
      local_30.value.ptr = value->ptr;
      local_30.value.size_ = value->size_;
      local_30.value.disposer = value->disposer;
      value->ptr = (uchar *)0x0;
      value->size_ = 0;
      local_30.id = typeId;
      Vector<kj::Exception::Detail>::add<kj::Exception::Detail>(&this->details,&local_30);
      Array<unsigned_char>::~Array(&local_30.value);
      return;
    }
    if (pDVar1->id == typeId) break;
    pDVar1 = pDVar1 + 1;
  }
  Array<unsigned_char>::operator=(&pDVar1->value,value);
  return;
}

Assistant:

void Exception::setDetail(DetailTypeId typeId, kj::Array<byte> value) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      detail.value = kj::mv(value);
      return;
    }
  }
  details.add(Detail {
    .id = typeId,
    .value = kj::mv(value),
  });
}